

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O0

void tcmalloc::InvokeNewHookSlow(void *p,size_t s)

{
  bool bVar1;
  int iVar2;
  int local_60;
  int i;
  int num_hooks;
  NewHook hooks [7];
  size_t s_local;
  void *p_local;
  
  bVar1 = IsEmergencyPtr(p);
  if (!bVar1) {
    iVar2 = ::base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Traverse
                      ((HookList<void_(*)(const_void_*,_unsigned_long)> *)
                       ::base::internal::new_hooks_,(_func_void_void_ptr_unsigned_long **)&i,7);
    for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
      (**(code **)(&i + (long)local_60 * 2))(p,s);
    }
  }
  return;
}

Assistant:

void InvokeNewHookSlow(const void* p, size_t s) {
  if (IsEmergencyPtr(p)) {
    return;
  }
  MallocHook::NewHook hooks[kHookListMaxValues];
  int num_hooks = base::internal::new_hooks_.Traverse(hooks, kHookListMaxValues);
  for (int i = 0; i < num_hooks; i++) {
    hooks[i](p, s);
  }
}